

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Gia_Man_t * Acb_CreateMiter(Gia_Man_t *pF,Gia_Man_t *pG)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  
  Gia_ManFillValue(pF);
  Gia_ManFillValue(pG);
  p = Gia_ManStart(pF->nObjs * 2 + 1000);
  Gia_ManHashAlloc(p);
  pF->pObjs->Value = 0;
  pG->pObjs->Value = 0;
  pVVar8 = pF->vCis;
  uVar10 = pVVar8->nSize;
  uVar11 = (ulong)uVar10;
  if (0 < (int)uVar10) {
    lVar16 = 0;
    do {
      uVar10 = (uint)uVar11;
      iVar5 = pVVar8->pArray[lVar16];
      if (((long)iVar5 < 0) || (pF->nObjs <= iVar5)) goto LAB_00370463;
      pGVar2 = pF->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p);
      uVar11 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p->nObjs <= pGVar7)) {
LAB_003704a1:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p->nObjs <= pGVar7)) goto LAB_003704a1;
      pGVar2[iVar5].Value = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar8 = pF->vCis;
      uVar10 = pVVar8->nSize;
      uVar11 = (ulong)(int)uVar10;
    } while (lVar16 < (long)uVar11);
  }
  uVar11 = (ulong)pG->vCis->nSize;
  if (0 < (long)uVar11) {
    piVar4 = pG->vCis->pArray;
    uVar15 = 0;
    uVar12 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar12 = uVar15;
    }
    do {
      iVar5 = piVar4[uVar15];
      if (((long)iVar5 < 0) || (pG->nObjs <= iVar5)) goto LAB_00370463;
      if (pG->pObjs == (Gia_Obj_t *)0x0) break;
      if (uVar12 == uVar15) goto LAB_003704c0;
      iVar6 = pVVar8->pArray[uVar15];
      if (((long)iVar6 < 0) || (pF->nObjs <= iVar6)) goto LAB_00370463;
      pG->pObjs[iVar5].Value = pF->pObjs[iVar6].Value;
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
  }
  iVar5 = pF->nObjs;
  if (0 < iVar5) {
    lVar16 = 8;
    lVar17 = 0;
    do {
      pGVar2 = pF->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(ulong *)((long)pGVar2 + lVar16 + -8);
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar10 = *(uint *)((long)pGVar2 +
                          lVar16 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar14 = *(uint *)((long)pGVar2 +
                              lVar16 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar14 < 0)) goto LAB_00370482;
        iVar5 = Gia_ManHashAnd(p,uVar10 ^ (uint)(uVar11 >> 0x1d) & 1,
                               uVar14 ^ (uint)(uVar11 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar16) = iVar5;
        iVar5 = pF->nObjs;
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar17 < iVar5);
  }
  iVar5 = pG->nObjs;
  if (0 < iVar5) {
    lVar16 = 8;
    lVar17 = 0;
    do {
      pGVar2 = pG->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(ulong *)((long)pGVar2 + lVar16 + -8);
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar10 = *(uint *)((long)pGVar2 +
                          lVar16 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar14 = *(uint *)((long)pGVar2 +
                              lVar16 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar14 < 0)) goto LAB_00370482;
        iVar5 = Gia_ManHashAnd(p,uVar10 ^ (uint)(uVar11 >> 0x1d) & 1,
                               uVar14 ^ (uint)(uVar11 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar16) = iVar5;
        iVar5 = pG->nObjs;
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar17 < iVar5);
  }
  pVVar8 = pG->vCos;
  if (pVVar8->nSize < 1) {
    iVar5 = 0;
  }
  else {
    lVar16 = 0;
    iVar5 = 0;
    do {
      iVar6 = pVVar8->pArray[lVar16];
      if (((long)iVar6 < 0) || (pG->nObjs <= iVar6)) goto LAB_00370463;
      if (pG->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pG->pObjs + iVar6;
      uVar14 = (uint)*(undefined8 *)pGVar2;
      uVar10 = pGVar2[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar10 < 0) goto LAB_00370482;
      if (pF->vCos->nSize <= lVar16) {
LAB_003704c0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = pF->vCos->pArray[lVar16];
      if (((long)iVar6 < 0) || (pF->nObjs <= iVar6)) goto LAB_00370463;
      uVar13 = (uint)*(undefined8 *)(pF->pObjs + iVar6);
      uVar1 = (pF->pObjs + iVar6)[-(ulong)(uVar13 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_00370482;
      iVar6 = Gia_ManHashXor(p,uVar14 >> 0x1d & 1 ^ uVar10,uVar13 >> 0x1d & 1 ^ uVar1);
      iVar5 = Gia_ManHashOr(p,iVar5,iVar6);
      lVar16 = lVar16 + 1;
      pVVar8 = pG->vCos;
    } while (lVar16 < pVVar8->nSize);
  }
  Gia_ManAppendCo(p,iVar5);
  pVVar8 = pF->vCos;
  if (0 < pVVar8->nSize) {
    lVar16 = 0;
    do {
      iVar5 = pVVar8->pArray[lVar16];
      if (((long)iVar5 < 0) || (pF->nObjs <= iVar5)) {
LAB_00370463:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pF->pObjs == (Gia_Obj_t *)0x0) break;
      if (pG->vCos->nSize <= lVar16) {
        pGVar2 = pF->pObjs + iVar5;
        uVar14 = (uint)*(undefined8 *)pGVar2;
        uVar10 = pGVar2[-(ulong)(uVar14 & 0x1fffffff)].Value;
        if ((int)uVar10 < 0) {
LAB_00370482:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p,uVar14 >> 0x1d & 1 ^ uVar10);
        pVVar8 = pF->vCos;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar8->nSize);
  }
  Gia_ManHashStop(p);
  pGVar9 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar9;
}

Assistant:

Gia_Man_t * Acb_CreateMiter( Gia_Man_t * pF, Gia_Man_t * pG )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i, iMiter = 0, iXor;
    Gia_ManFillValue( pF );
    Gia_ManFillValue( pG );
    pNew = Gia_ManStart( Gia_ManObjNum(pF) + Gia_ManObjNum(pF) + 1000 );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pF)->Value = 0;
    Gia_ManConst0(pG)->Value = 0;
    Gia_ManForEachCi( pF, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( pG, pObj, i )
        pObj->Value = Gia_ManCi(pF, i)->Value;
    Gia_ManForEachAnd( pF, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( pG, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pG, pObj, i )
    {
        iXor = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManCo(pF, i)) );
        iMiter = Gia_ManHashOr( pNew, iMiter, iXor );
    }
    Gia_ManAppendCo( pNew, iMiter );
    Gia_ManForEachCo( pF, pObj, i )
        if ( i >= Gia_ManCoNum(pG) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}